

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::ValidateMessageOptions
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  long lVar1;
  Type *pTVar2;
  Type *proto_00;
  Type *proto_01;
  Type *descriptor;
  size_t sVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  string local_250;
  string local_230;
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  if (0 < *(int *)(message + 4)) {
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar5 = *(long *)(message + 0x28);
      pTVar2 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(proto->field_).super_RepeatedPtrFieldBase,(int)lVar6);
      ValidateFieldOptions(this,(FieldDescriptor *)(lVar5 + lVar4),pTVar2);
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 0x48;
    } while (lVar6 < *(int *)(message + 4));
  }
  if (0 < *(int *)(message + 0x70)) {
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar5 = *(long *)(message + 0x38);
      proto_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                           (&(proto->nested_type_).super_RepeatedPtrFieldBase,(int)lVar6);
      ValidateMessageOptions(this,(Descriptor *)(lVar5 + lVar4),proto_00);
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 0x88;
    } while (lVar6 < *(int *)(message + 0x70));
  }
  if (0 < *(int *)(message + 0x74)) {
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar5 = *(long *)(message + 0x40);
      proto_01 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                           (&(proto->enum_type_).super_RepeatedPtrFieldBase,(int)lVar6);
      ValidateEnumOptions(this,(EnumDescriptor *)(lVar5 + lVar4),proto_01);
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 0x48;
    } while (lVar6 < *(int *)(message + 0x74));
  }
  if (0 < *(int *)(message + 0x7c)) {
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar5 = *(long *)(message + 0x50);
      pTVar2 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(proto->extension_).super_RepeatedPtrFieldBase,(int)lVar6);
      ValidateFieldOptions(this,(FieldDescriptor *)(lVar5 + lVar4),pTVar2);
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 0x48;
    } while (lVar6 < *(int *)(message + 0x7c));
  }
  lVar4 = 0x1fffffff;
  if (*(char *)(*(long *)(message + 0x20) + 0x48) != '\0') {
    lVar4 = 0x7fffffff;
  }
  if (0 < *(int *)(message + 0x78)) {
    lVar6 = 4;
    lVar5 = 0;
    do {
      if (lVar4 + 1 < (long)*(int *)(*(long *)(message + 0x48) + lVar6)) {
        lVar1 = *(long *)(message + 8);
        descriptor = internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                               (&(proto->extension_range_).super_RepeatedPtrFieldBase,(int)lVar5);
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,"Extension numbers cannot be greater than $0.","");
        local_210.text_ = FastInt64ToBuffer(lVar4,local_210.scratch_);
        sVar3 = strlen(local_210.text_);
        local_210.size_ = (int)sVar3;
        local_60.text_ = (char *)0x0;
        local_60.size_ = -1;
        local_90.text_ = (char *)0x0;
        local_90.size_ = -1;
        local_c0.text_ = (char *)0x0;
        local_c0.size_ = -1;
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        local_1e0.text_ = (char *)0x0;
        local_1e0.size_ = -1;
        strings::Substitute(&local_230,&local_250,&local_210,&local_60,&local_90,&local_c0,&local_f0
                            ,&local_120,&local_150,&local_180,&local_1b0,&local_1e0);
        AddError(this,(string *)(lVar1 + 0x20),&descriptor->super_Message,NUMBER,&local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p);
        }
      }
      internal::RepeatedPtrFieldBase::
      Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                (&(proto->extension_range_).super_RepeatedPtrFieldBase,(int)lVar5);
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar5 < *(int *)(message + 0x78));
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateMessageOptions(Descriptor* message,
                                               const DescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(message, field, Field);
  VALIDATE_OPTIONS_FROM_ARRAY(message, nested_type, Message);
  VALIDATE_OPTIONS_FROM_ARRAY(message, enum_type, Enum);
  VALIDATE_OPTIONS_FROM_ARRAY(message, extension, Field);

  const int64_t max_extension_range =
      static_cast<int64_t>(message->options().message_set_wire_format()
                               ? std::numeric_limits<int32_t>::max()
                               : FieldDescriptor::kMaxNumber);
  for (int i = 0; i < message->extension_range_count(); ++i) {
    if (message->extension_range(i)->end > max_extension_range + 1) {
      AddError(message->full_name(), proto.extension_range(i),
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("Extension numbers cannot be greater than $0.",
                                max_extension_range));
    }

    ValidateExtensionRangeOptions(message->full_name(),
                                  message->extension_ranges_ + i,
                                  proto.extension_range(i));
  }
}